

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall
TS_program_association_section::TS_program_association_section(TS_program_association_section *this)

{
  TS_program_association_section *this_local;
  
  this->transport_stream_id = 0;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            (&this->pmtPids);
  this->m_nitPID = -1;
  return;
}

Assistant:

TS_program_association_section::TS_program_association_section() : transport_stream_id(0)
{
    m_nitPID = -1;
    // av_crc_init(tmpAvCrc, 0, 32, 0x04c11db7, sizeof(AVCRC)*257);
}